

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O1

void correct_reed_solomon_debug_print(correct_reed_solomon *rs)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint i;
  ulong uVar6;
  polynomial_t poly;
  
  uVar6 = 0;
  do {
    printf("%3d  %3d    %3d  %3d\n",uVar6 & 0xffffffff,(ulong)(rs->field).exp[uVar6],
           uVar6 & 0xffffffff,(ulong)(rs->field).log[uVar6]);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x100);
  putchar(10);
  printf("roots: ");
  if (rs->min_distance != 0) {
    uVar3 = 1;
    uVar6 = 0;
    do {
      printf("%d",(ulong)rs->generator_roots[uVar6]);
      if (uVar6 < rs->min_distance - 1) {
        printf(", ");
      }
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar6 < rs->min_distance);
  }
  puts("\n");
  printf("generator: ");
  if ((rs->generator).order != 0xffffffff) {
    uVar6 = 0;
    do {
      printf("%d*x^%d",(ulong)(rs->generator).coeff[uVar6],uVar6 & 0xffffffff);
      if (uVar6 < (rs->generator).order) {
        printf(" + ");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->generator).order + 1);
  }
  puts("\n");
  printf("generator (alpha format): ");
  uVar3 = (rs->generator).order;
  uVar6 = (ulong)uVar3;
  uVar3 = uVar3 + 1;
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      printf("alpha^%d*x^%d",(ulong)(rs->field).log[(rs->generator).coeff[uVar6]],uVar6 & 0xffffffff
            );
      if ((ulong)uVar3 - 1 != lVar4) {
        printf(" + ");
      }
      lVar4 = lVar4 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar3 != (uint)lVar4);
  }
  puts("\n");
  printf("remainder: ");
  if ((rs->encoded_remainder).order != 0xffffffff) {
    bVar1 = false;
    uVar6 = 0;
    do {
      if ((rs->encoded_remainder).coeff[uVar6] != '\0') {
        if (bVar1) {
          printf(" + ");
        }
        printf("%d*x^%d",(ulong)(rs->encoded_remainder).coeff[uVar6],uVar6 & 0xffffffff);
        bVar1 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->encoded_remainder).order + 1);
  }
  puts("\n");
  printf("syndromes: ");
  if (rs->min_distance != 0) {
    uVar3 = 1;
    uVar6 = 0;
    do {
      printf("%d",(ulong)rs->syndromes[uVar6]);
      if (uVar6 < rs->min_distance - 1) {
        printf(", ");
      }
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar6 < rs->min_distance);
  }
  puts("\n");
  printf("numerrors: %d\n\n",(ulong)(rs->error_locator).order);
  printf("error locator: ");
  if ((rs->error_locator).order != 0xffffffff) {
    bVar1 = false;
    uVar6 = 0;
    do {
      if ((rs->error_locator).coeff[uVar6] != '\0') {
        if (bVar1) {
          printf(" + ");
        }
        printf("%d*x^%d",(ulong)(rs->error_locator).coeff[uVar6],uVar6 & 0xffffffff);
        bVar1 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->error_locator).order + 1);
  }
  puts("\n");
  printf("error roots: ");
  uVar3 = (rs->error_locator).order;
  uVar6 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      poly._8_8_ = uVar6;
      poly.coeff = (rs->error_locator).coeff;
      bVar2 = polynomial_eval(rs->field,poly,rs->error_roots[uVar5]);
      printf("%d@%d",(ulong)bVar2,(ulong)rs->error_roots[uVar5]);
      if (uVar5 < (rs->error_locator).order - 1) {
        printf(", ");
      }
      uVar5 = uVar5 + 1;
      uVar6 = (ulong)(rs->error_locator).order;
    } while (uVar5 < uVar6);
  }
  puts("\n");
  printf("error evaluator: ");
  if ((rs->error_evaluator).order != 0) {
    bVar1 = false;
    uVar6 = 0;
    do {
      if ((rs->error_evaluator).coeff[uVar6] != '\0') {
        if (bVar1) {
          printf(" + ");
        }
        printf("%d*x^%d",(ulong)(rs->error_evaluator).coeff[uVar6],uVar6 & 0xffffffff);
        bVar1 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->error_evaluator).order);
  }
  puts("\n");
  printf("error locator derivative: ");
  if ((rs->error_locator_derivative).order != 0) {
    bVar1 = false;
    uVar6 = 0;
    do {
      if ((rs->error_locator_derivative).coeff[uVar6] != '\0') {
        if (bVar1) {
          printf(" + ");
        }
        printf("%d*x^%d",(ulong)(rs->error_locator_derivative).coeff[uVar6],uVar6 & 0xffffffff);
        bVar1 = true;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->error_locator_derivative).order);
  }
  puts("\n");
  printf("error locator: ");
  if ((rs->error_locator).order != 0) {
    uVar6 = 0;
    do {
      printf("%d@%d",(ulong)rs->error_vals[uVar6],(ulong)rs->error_locations[uVar6]);
      if (uVar6 < (rs->error_locator).order - 1) {
        printf(", ");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (rs->error_locator).order);
  }
  puts("\n");
  return;
}

Assistant:

void correct_reed_solomon_debug_print(correct_reed_solomon *rs) {
    for (unsigned int i = 0; i < 256; i++) {
        printf("%3d  %3d    %3d  %3d\n", i, rs->field.exp[i], i, rs->field.log[i]);
    }
    printf("\n");

    printf("roots: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->generator_roots[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("generator: ");
    for (unsigned int i = 0; i < rs->generator.order + 1; i++) {
        printf("%d*x^%d", rs->generator.coeff[i], i);
        if (i < rs->generator.order) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("generator (alpha format): ");
    for (unsigned int i = rs->generator.order + 1; i > 0; i--) {
        printf("alpha^%d*x^%d", rs->field.log[rs->generator.coeff[i - 1]], i - 1);
        if (i > 1) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("remainder: ");
    bool has_printed = false;
    for (unsigned int i = 0; i < rs->encoded_remainder.order + 1; i++) {
        if (!rs->encoded_remainder.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->encoded_remainder.coeff[i], i);
    }
    printf("\n\n");

    printf("syndromes: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->syndromes[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("numerrors: %d\n\n", rs->error_locator.order);

    printf("error locator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator.order + 1; i++) {
        if (!rs->error_locator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator.coeff[i], i);
    }
    printf("\n\n");

    printf("error roots: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", polynomial_eval(rs->field, rs->error_locator, rs->error_roots[i]), rs->error_roots[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("error evaluator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_evaluator.order; i++) {
        if (!rs->error_evaluator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_evaluator.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator derivative: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator_derivative.order; i++) {
        if (!rs->error_locator_derivative.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator_derivative.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", rs->error_vals[i], rs->error_locations[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");
}